

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O1

int toknext(tokcxdef *ctx)

{
  char *str;
  toksdef *ptVar1;
  byte *src;
  byte bVar2;
  ushort uVar3;
  ushort *puVar4;
  short sVar5;
  bool bVar6;
  short sVar7;
  ushort uVar8;
  int iVar9;
  ushort **ppuVar10;
  __int32_t **pp_Var11;
  undefined8 uVar12;
  tokdfdef *ptVar13;
  tokscdef *ptVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint len;
  long lVar20;
  toktdef *ptVar21;
  char *pcVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  size_t sVar26;
  char *pcVar27;
  char mysym [39];
  char *local_70;
  char local_58 [40];
  
  uVar24 = ctx->tokcxflg;
  if ((uVar24 & 8) != 0) {
    (ctx->tokcxcur).toktyp = 0x35;
    ctx->tokcxflg = uVar24 & 0xfffffff7;
    return 0x35;
  }
  pcVar27 = ctx->tokcxptr;
  uVar15 = (ulong)ctx->tokcxlen;
LAB_00116128:
  do {
    if ((int)uVar15 == 0) {
      lVar20 = (long)ctx->tokcxmlvl;
      if (lVar20 == 0) {
        iVar9 = tokgetlin(ctx,1);
        pcVar22 = pcVar27;
        if (iVar9 != 0) {
LAB_00116aaa:
          (ctx->tokcxcur).toktyp = 1;
          uVar8 = 0;
          goto LAB_00116abe;
        }
        pcVar27 = ctx->tokcxptr;
        uVar15 = (ulong)ctx->tokcxlen;
      }
      else {
        ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
        pcVar27 = ctx->tokcxmsav[lVar20 + -1];
        uVar15 = (ulong)ctx->tokcxmsvl[lVar20 + -1];
      }
    }
    if ((int)uVar15 != 0) {
      pcVar22 = pcVar27 + (ulong)((int)uVar15 - 1) + 1;
      do {
        bVar23 = *pcVar27;
        if (((long)(char)bVar23 < 0) ||
           (ppuVar10 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar10 + (long)(char)bVar23 * 2 + 1) & 0x20) == 0))
        goto LAB_001161b7;
        pcVar27 = pcVar27 + 1;
        uVar24 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar24;
      } while (uVar24 != 0);
      uVar15 = 0;
      pcVar27 = pcVar22;
    }
LAB_001161b7:
    sVar26 = uVar15;
    if ((1 < (int)uVar15) && (*pcVar27 == 0x2fU)) {
      if (pcVar27[1] != 0x2f && *pcVar27 == 0x2fU) {
        if (pcVar27[1] == 0x2a) {
          while (((iVar9 = (int)uVar15, iVar9 < 2 || (*pcVar27 != 0x2a)) || (pcVar27[1] != 0x2f))) {
            pcVar27 = pcVar27 + (iVar9 != 0);
            uVar15 = (ulong)(iVar9 - 1U);
            if (iVar9 == 0) {
              uVar15 = 0;
            }
            if (iVar9 == 0 || iVar9 - 1U == 0) {
              lVar20 = (long)ctx->tokcxmlvl;
              if (lVar20 == 0) {
                iVar9 = tokgetlin(ctx,0);
                if (iVar9 != 0) {
                  ctx->tokcxptr = pcVar27;
                  pcVar22 = pcVar27;
                  goto LAB_00116aaa;
                }
                pcVar27 = ctx->tokcxptr;
                uVar15 = (ulong)ctx->tokcxlen;
              }
              else {
                ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
                pcVar27 = ctx->tokcxmsav[lVar20 + -1];
                uVar15 = (ulong)ctx->tokcxmsvl[lVar20 + -1];
              }
            }
          }
          pcVar27 = pcVar27 + 2;
          uVar15 = (ulong)(iVar9 - 2);
          goto LAB_00116128;
        }
      }
      else if (pcVar27[1] == 0x2f) {
        sVar26 = 0;
      }
    }
    uVar15 = 0;
  } while ((int)sVar26 == 0);
  ppuVar10 = __ctype_b_loc();
  str = (ctx->tokcxcur).toknam;
  ptVar1 = &(ctx->tokcxcur).toksym;
LAB_001162b7:
  do {
    while( true ) {
      puVar4 = *ppuVar10;
      bVar23 = *pcVar27;
      uVar24 = (uint)sVar26;
      if ((((puVar4[bVar23] >> 10 & 1) != 0) || (bVar23 == 0x5f)) || (bVar23 == 0x24)) {
        if (uVar24 == 0) {
          uVar17 = 0;
          pcVar22 = str;
          local_70 = pcVar27;
        }
        else {
          lVar20 = 0;
          uVar17 = 0;
          do {
            bVar23 = pcVar27[lVar20];
            len = (uint)lVar20;
            if ((((bVar23 != 0x5f) && (((*ppuVar10)[bVar23] & 0xc00) == 0)) && (bVar23 != 0x24)) ||
               (0x26 < len)) {
              str[lVar20] = '\0';
              local_70 = pcVar27 + lVar20;
              bVar23 = pcVar27[lVar20];
              sVar26 = (sVar26 & 0xffffffff) - lVar20;
              if (((((*ppuVar10)[bVar23] & 0xc00) == 0) && (bVar23 != 0x24)) && (bVar23 != 0x5f))
              goto LAB_0011641b;
              goto LAB_001163ad;
            }
            if ((((*ppuVar10)[bVar23] >> 8 & 1) != 0) && ((ctx->tokcxflg & 2) != 0)) {
              pp_Var11 = __ctype_tolower_loc();
              bVar23 = *(byte *)(*pp_Var11 + bVar23);
            }
            uVar17 = (uint)(byte)((char)uVar17 + bVar23);
            str[lVar20] = bVar23;
            lVar20 = lVar20 + 1;
          } while (uVar24 != (uint)lVar20);
          pcVar22 = str + lVar20;
          local_70 = pcVar27 + lVar20;
        }
        sVar26 = 0;
        *pcVar22 = '\0';
        len = uVar24;
        goto LAB_0011641b;
      }
      if ((puVar4[bVar23] >> 0xb & 1) != 0) {
        if (bVar23 == 0x30) {
          pcVar22 = pcVar27 + 1;
          iVar9 = uVar24 - 1;
          if (iVar9 != 0) {
            if ((byte)(*pcVar22 | 0x20U) != 0x78) {
              lVar16 = 0;
              goto LAB_00116c5d;
            }
            pcVar22 = pcVar27 + 2;
            iVar9 = uVar24 - 2;
            if (iVar9 != 0) {
              lVar20 = (ulong)(uVar24 - 3) + 3;
              lVar16 = 0;
              goto LAB_00116b44;
            }
          }
        }
        else {
          pcVar22 = pcVar27;
          if (uVar24 != 0) {
            lVar20 = (ulong)(uVar24 - 1) + 1;
            lVar16 = 0;
            goto LAB_00116c15;
          }
        }
        iVar9 = 0;
        lVar16 = 0;
        goto LAB_00116c96;
      }
      sVar5 = (short)sVar26;
      if ((bVar23 == 0x27) || (bVar23 == 0x22)) break;
      if (((((int)uVar24 < 2) || (bVar23 != 0x3e)) || (pcVar27[1] != 0x3e)) ||
         ((ctx->tokcxflg & 1U) == 0)) {
        ptVar14 = ctx->tokcxsc[ctx->tokcxinx[bVar23]];
        while( true ) {
          if (ptVar14 == (tokscdef *)0x0) {
            errsigf(ctx->tokcxerr,"TADS",100);
          }
          iVar9 = ptVar14->toksclen;
          if ((iVar9 <= (int)uVar24) &&
             ((iVar9 == 1 ||
              ((ptVar14->tokscstr[1] == pcVar27[1] &&
               ((iVar9 == 2 || (ptVar14->tokscstr[2] == pcVar27[2])))))))) break;
          ptVar14 = ptVar14->tokscnxt;
        }
        (ctx->tokcxcur).toktyp = ptVar14->toksctyp;
        pcVar22 = pcVar27 + ptVar14->toksclen;
        uVar8 = sVar5 - (short)ptVar14->toksclen;
        goto LAB_00116abe;
      }
      ctx->tokcxflg = ctx->tokcxflg & 0xfffffffe;
      if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00116cd7;
      ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27 + 2;
      ctx->tokcxmsvl[ctx->tokcxmlvl] = sVar5 - 2;
      iVar9 = ctx->tokcxmlvl;
      ctx->tokcxmlvl = iVar9 + 1;
      if (pcVar27[2] == 0x22) {
        ctx->tokcxmsav[iVar9] = ctx->tokcxmsav[iVar9] + 1;
        ctx->tokcxmsvl[(long)ctx->tokcxmlvl + -1] = ctx->tokcxmsvl[(long)ctx->tokcxmlvl + -1] - 1;
        uVar24 = ctx->tokcxflg & 0xffffffef;
        pcVar27 = tokmac3;
      }
      else {
        uVar24 = ctx->tokcxflg | 0x10;
        pcVar27 = tokmac2;
      }
      ctx->tokcxflg = uVar24;
      sVar26 = strlen(pcVar27);
    }
    pcVar22 = pcVar27 + 1;
    if ((bVar23 == 0x22) && (((2 < (int)uVar24 && (*pcVar22 == 0x3c)) && (pcVar27[2] == 0x3c)))) {
      if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00116cd7;
      ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27 + 3;
      ctx->tokcxmsvl[ctx->tokcxmlvl] = sVar5 - 3;
      ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
      pcVar27 = tokmac1s;
      sVar26 = strlen(tokmac1s);
      uVar24 = (uint)sVar26;
      *(byte *)&ctx->tokcxflg = (byte)ctx->tokcxflg | 1;
      iVar9 = 10;
    }
    else {
      sVar26 = (size_t)(uVar24 - 1);
      (ctx->tokcxcur).toktyp = (bVar23 != 0x22) + 0x35;
      uVar8 = (*ctx->tokcxsst)(ctx->tokcxscx);
      (ctx->tokcxcur).tokofs = uVar8;
      bVar6 = false;
      pcVar27 = pcVar22;
LAB_001165dd:
      while( true ) {
        while( true ) {
          iVar18 = (int)sVar26;
          sVar5 = (short)pcVar27;
          sVar7 = (short)pcVar22;
          if ((iVar18 < 2) || (*pcVar27 != 0x5c)) break;
          if ((pcVar27[1] == 0x27) || (pcVar27[1] == 0x22)) {
            (*ctx->tokcxsad)(ctx->tokcxscx,pcVar22,sVar5 - sVar7);
            pcVar22 = pcVar27 + 1;
          }
          sVar26 = (size_t)(iVar18 - 2);
          pcVar27 = pcVar27 + 2;
        }
        if (iVar18 != 0) break;
        (*ctx->tokcxsad)(ctx->tokcxscx,pcVar22,sVar5 - sVar7);
LAB_0011664e:
        lVar20 = (long)ctx->tokcxmlvl;
        if (lVar20 == 0) {
          (*ctx->tokcxsad)(ctx->tokcxscx," ",1);
          goto LAB_001166b2;
        }
        ctx->tokcxmlvl = ctx->tokcxmlvl + -1;
        pcVar22 = ctx->tokcxmsav[lVar20 + -1];
        sVar26 = (size_t)ctx->tokcxmsvl[lVar20 + -1];
LAB_001166b5:
        pcVar27 = pcVar22;
        if ((int)sVar26 == 0) {
          iVar9 = tokgetlin(ctx,0);
          if (iVar9 != 0) {
            errsigf(ctx->tokcxerr,"TADS",0x65);
          }
          pcVar22 = ctx->tokcxptr;
          uVar3 = ctx->tokcxlen;
          if ((uVar3 != 0 && !bVar6) && ((*pcVar22 == 0x7d || (bVar6 = false, *pcVar22 == 0x3b)))) {
            errlogf(ctx->tokcxerr,"TADS",0x159);
            bVar6 = true;
          }
          sVar26 = (size_t)uVar3;
          if (uVar3 != 0) {
            pcVar27 = pcVar22 + (ulong)(uVar3 - 1) + 1;
            do {
              if (((long)*pcVar22 < 0) ||
                 ((*(byte *)((long)*ppuVar10 + (long)*pcVar22 * 2 + 1) & 0x20) == 0))
              goto LAB_001166b5;
              pcVar22 = pcVar22 + 1;
              uVar24 = (int)sVar26 - 1;
              sVar26 = (size_t)uVar24;
            } while (uVar24 != 0);
LAB_001166b2:
            pcVar22 = pcVar27;
            sVar26 = 0;
          }
          goto LAB_001166b5;
        }
      }
      if ((*pcVar27 != bVar23) &&
         (((bVar23 != 0x22 || (iVar18 < 2)) ||
          ((*pcVar27 != 0x3c || ((pcVar27[1] != 0x3c || ((ctx->tokcxflg & 1) != 0)))))))) {
        pcVar27 = pcVar27 + 1;
        sVar26 = (size_t)(iVar18 - 1);
        goto LAB_001165dd;
      }
      (*ctx->tokcxsad)(ctx->tokcxscx,pcVar22,sVar5 - sVar7);
      if (iVar18 == 0) goto LAB_0011664e;
      uVar12 = (*ctx->tokcxsend)(ctx->tokcxscx);
      bVar2 = *pcVar27;
      uVar24 = (uint)CONCAT71((int7)((ulong)uVar12 >> 8),bVar2);
      if (bVar2 == bVar23) {
        pcVar27 = pcVar27 + 1;
        sVar26 = (size_t)(iVar18 - 1U);
        uVar24 = ctx->tokcxflg;
        iVar9 = 5;
        if ((uVar24 & 0x11) == 0x10) {
          ctx->tokcxflg = uVar24 & 0xffffffee;
          if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00116cd7;
          ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27;
          ctx->tokcxmsvl[ctx->tokcxmlvl] = (ushort)(iVar18 - 1U);
          ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
          pcVar27 = tokmac4;
          sVar26 = strlen(tokmac4);
          uVar24 = (uint)sVar26;
        }
        else {
LAB_0011690d:
          iVar9 = 5;
        }
      }
      else {
        iVar9 = 5;
        if (bVar2 != 0x3c) goto LAB_0011690d;
        if (0x13 < (long)ctx->tokcxmlvl) goto LAB_00116cd7;
        ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27 + 2;
        ctx->tokcxmsvl[ctx->tokcxmlvl] = (short)sVar26 - 2;
        ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
        pcVar27 = tokmac1;
        sVar26 = strlen(tokmac1);
        uVar24 = ctx->tokcxflg;
        ctx->tokcxflg = uVar24 | 1;
        if ((uVar24 & 0x10) == 0) {
          uVar24 = uVar24 | 9;
          ctx->tokcxflg = uVar24;
          (ctx->tokcxcur).toktyp = 0x32;
        }
      }
    }
    pcVar22 = pcVar27;
  } while (iVar9 == 10);
  goto joined_r0x00116abc;
  while( true ) {
    local_70 = local_70 + 1;
    uVar25 = (int)sVar26 - 1;
    sVar26 = (size_t)uVar25;
    if (uVar25 == 0) break;
LAB_001163ad:
    bVar23 = *local_70;
    if (((((*ppuVar10)[bVar23] & 0xc00) == 0) && (bVar23 != 0x5f)) && (bVar23 != 0x24))
    goto LAB_001163d5;
  }
  sVar26 = 0;
  local_70 = pcVar27 + (ulong)(uVar24 - 1) + 1;
LAB_001163d5:
  pcVar27 = errstr(ctx->tokcxerr,str,(ctx->tokcxcur).toklen);
  ctx->tokcxerr->errcxptr->erraav[0].errastr = pcVar27;
  ctx->tokcxerr->errcxptr->erraac = 1;
  errlogn(ctx->tokcxerr,0x66,"TADS");
LAB_0011641b:
  pcVar27 = local_70;
  (ctx->tokcxcur).toklen = len;
  (ctx->tokcxcur).tokhash = uVar17;
  if (len == 9) {
    pcVar22 = "__defined";
    if ((ctx->tokcxflg & 2) == 0) {
      pcVar22 = "__DEFINED";
    }
    iVar9 = (int)sVar26;
    if (((2 < iVar9) &&
        ((ctx->tokcxcur).toknam[8] == (char)*(long *)((long)pcVar22 + 8) &&
         *(long *)(ctx->tokcxcur).toknam == *(long *)pcVar22)) && (*pcVar27 == 0x28)) {
      bVar23 = pcVar27[1];
      if ((((((*ppuVar10)[bVar23] & 0xc00) != 0) || (bVar23 == 0x5f)) || (bVar23 == 0x24)) &&
         (((*ppuVar10)[bVar23] >> 0xb & 1) == 0)) {
        if (iVar9 == 1) {
LAB_00116cc3:
          errsigf(ctx->tokcxerr,"TADS",0x79);
        }
        src = (byte *)(pcVar27 + 1);
        pcVar27 = pcVar27 + 2;
        iVar18 = 0;
        while( true ) {
          bVar23 = pcVar27[-1];
          uVar15 = (ulong)bVar23;
          if (uVar15 == 0x29) break;
          if (((((*ppuVar10)[uVar15] & 0xc00) == 0) && (uVar15 != 0x5f)) && (bVar23 != 0x24)) {
            if (bVar23 != 0x29) goto LAB_00116cc3;
            break;
          }
          iVar18 = iVar18 + 1;
          pcVar27 = pcVar27 + 1;
          if (iVar9 + -1 == iVar18) goto LAB_00116cc3;
        }
        sVar26 = (size_t)((iVar9 - iVar18) - 2);
        pcVar22 = tok_casefold_defsym(ctx,local_58,(char *)src,iVar18);
        (ctx->tokcxcur).toktyp = 0x37;
        ptVar13 = tok_find_define(ctx,pcVar22,iVar18);
        (ctx->tokcxcur).tokval = (ulong)(ptVar13 != (tokdfdef *)0x0);
        iVar9 = 5;
        goto LAB_00116a09;
      }
    }
  }
  ptVar13 = tok_find_define(ctx,str,len);
  if (ptVar13 == (tokdfdef *)0x0) {
    for (ptVar21 = ctx->tokcxstab; ptVar21 != (toktdef *)0x0; ptVar21 = ptVar21->toktnxt) {
      uVar24 = (*ptVar21->toktfsea)(ptVar21,str,len,uVar17,ptVar1);
      ptVar13 = (tokdfdef *)(ulong)uVar24;
      if (uVar24 != 0) {
        if (ptVar1->tokstyp == '\v') {
          uVar3 = (ctx->tokcxcur).toksym.toksval;
          (ctx->tokcxcur).toktyp = (uint)uVar3;
          ptVar13 = (tokdfdef *)(ulong)uVar3;
        }
        else {
          (ctx->tokcxcur).toktyp = 0x38;
          ptVar13 = (tokdfdef *)ptVar1;
        }
        iVar9 = 5;
        goto LAB_00116a09;
      }
    }
    (ctx->tokcxcur).toktyp = 0x38;
    (ctx->tokcxcur).toksym.tokstyp = '\0';
    iVar9 = 5;
  }
  else {
    if (0x13 < (long)ctx->tokcxmlvl) {
LAB_00116cd7:
      errsigf(ctx->tokcxerr,"TADS",0x78);
    }
    ctx->tokcxmsav[ctx->tokcxmlvl] = pcVar27;
    ctx->tokcxmsvl[ctx->tokcxmlvl] = (ushort)sVar26;
    ctx->tokcxmlvl = ctx->tokcxmlvl + 1;
    pcVar27 = ptVar13->expan;
    sVar26 = (size_t)(uint)ptVar13->explen;
    iVar9 = 10;
  }
LAB_00116a09:
  uVar24 = (uint)ptVar13;
  pcVar22 = pcVar27;
  if (iVar9 != 10) goto joined_r0x00116abc;
  goto LAB_001162b7;
  while( true ) {
    lVar16 = (long)*pcVar22 + lVar16 * 10 + -0x30;
    pcVar22 = pcVar22 + 1;
    sVar26 = (size_t)(iVar9 - 1U);
    if (iVar9 - 1U == 0) break;
LAB_00116c15:
    iVar9 = (int)sVar26;
    if ((*(byte *)((long)puVar4 + (ulong)(byte)*pcVar22 * 2 + 1) & 8) == 0) goto LAB_00116c96;
  }
  goto LAB_00116c39;
  while( true ) {
    lVar16 = (long)(char)bVar23 + lVar16 * 8 + -0x30;
    pcVar22 = pcVar22 + 1;
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) break;
LAB_00116c5d:
    bVar23 = *pcVar22;
    if ((0xfd < (byte)(bVar23 - 0x3a)) || ((puVar4[bVar23] & 0x800) == 0)) goto LAB_00116c96;
  }
  iVar9 = 0;
  pcVar22 = pcVar27 + (ulong)(uVar24 - 2) + 2;
  goto LAB_00116c96;
joined_r0x00116abc:
  uVar8 = (ushort)sVar26;
  if (iVar9 != 5) {
    return uVar24;
  }
  goto LAB_00116abe;
  while( true ) {
    lVar19 = (ulong)((char)bVar23 < 'a') * 0x20 + -0x57;
    if ((puVar4[bVar23] >> 0xb & 1) != 0) {
      lVar19 = -0x30;
    }
    lVar16 = lVar16 * 0x10 + (long)(char)bVar23 + lVar19;
    pcVar22 = pcVar22 + 1;
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) break;
LAB_00116b44:
    bVar23 = *pcVar22;
    if (((puVar4[bVar23] >> 0xb & 1) == 0) &&
       ((0x25 < bVar23 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar23 - 0x41) & 0x3f) & 1) == 0))))
    goto LAB_00116c96;
  }
LAB_00116c39:
  pcVar22 = pcVar27 + lVar20;
  iVar9 = 0;
LAB_00116c96:
  (ctx->tokcxcur).tokval = lVar16;
  (ctx->tokcxcur).toktyp = 0x37;
  uVar8 = (ushort)iVar9;
LAB_00116abe:
  ctx->tokcxptr = pcVar22;
  ctx->tokcxlen = uVar8;
  return (ctx->tokcxcur).toktyp;
}

Assistant:

int toknext(tokcxdef *ctx)
{
    char   *p;
    tokdef *tok = &ctx->tokcxcur;
    int     len;

    /* 
     *   Check for the special case that we pushed an open paren prior to
     *   a string containing an embedded expression.  If this is the case,
     *   immediately return the string we previously parsed. 
     */
    if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_PRE) != 0)
    {
        /* 
         *   convert the token to a string - note that the offset
         *   information for the string is already in the current token
         *   structure, since we set everything up for it on the previous
         *   call where we actually parsed the beginning of the string 
         */
        tok->toktyp = TOKTDSTRING;

        /* clear the special flag - we've now consumed the pushed string */
        ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_PRE;

        /* immediately return the string */
        return tok->toktyp;
    }

    /* set up at the current scanning position */
    p = ctx->tokcxptr;
    len = ctx->tokcxlen;

    /* scan off whitespace and comments until we find something */
    do
    {
    skipblanks:
        /* if there's nothing on this line, get the next one */
        if (len == 0)
        {
            /* if we're in a macro expansion, continue after it */
            if (ctx->tokcxmlvl)
            {
                ctx->tokcxmlvl--;
                p = ctx->tokcxmsav[ctx->tokcxmlvl];
                len = ctx->tokcxmsvl[ctx->tokcxmlvl];
            }
            else
            {
                if (tokgetlin(ctx, TRUE))
                {
                    tok->toktyp = TOKTEOF;
                    goto done;
                }
                p = ctx->tokcxptr;
                len = ctx->tokcxlen;
            }
        }
        while (len && t_isspace(*p)) ++p, --len;     /* scan off whitespace */
        
        /* check for comments, and remove if present */
        if (len >= 2 && *p == '/' && *(p+1) == '/')
            len = 0;
        else if (len >= 2 && *p == '/' && *(p+1) == '*')
        {
            while (len < 2 || *p != '*' || *(p+1) != '/')
            {
                if (len != 0)
                    ++p, --len;

                if (len == 0)
                {
                    if (ctx->tokcxmlvl != 0)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                    {
                        if (tokgetlin(ctx, FALSE))
                        {
                            ctx->tokcxptr = p;
                            tok->toktyp = TOKTEOF;
                            goto done;
                        }
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;
                    }
                }
            }
            p += 2;
            len -= 2;
            goto skipblanks;
        }
    } while (len == 0);
    
nexttoken:
    if (isalpha((uchar)*p) || *p == '_' || *p == '$')
    {
        int       l;
        int       hash;
        char     *q;
        toktdef  *tab;
        int       found = FALSE;
        uchar     thischar;
        tokdfdef *df;
        
        for (hash = 0, l = 0, q = tok->toknam ;
             len != 0 && TOKISSYM(*p) && l < TOKNAMMAX ;
             (thischar = ((isupper((uchar)*p)
                           && (ctx->tokcxflg & TOKCXCASEFOLD))
                          ? tolower((uchar)*p) : *p)),
             (hash = ((hash + thischar) & (TOKHASHSIZE - 1))),
             (*q++ = thischar), ++p, --len, ++l) ;
        *q = '\0';
        if (len != 0 && TOKISSYM(*p))
        {
            while (len != 0 && TOKISSYM(*p)) ++p, --len;
            errlog1(ctx->tokcxerr, ERR_TRUNC, ERRTSTR,
                    errstr(ctx->tokcxerr, tok->toknam, tok->toklen));
        }
        tok->toklen = l;
        tok->tokhash = hash;

        /*
         *   check for the special defined() preprocessor operator 
         */
        if (l == 9 && !memcmp(tok->toknam,
                              ((ctx->tokcxflg & TOKCXCASEFOLD)
                               ? "__defined" : "__DEFINED"),
                              (size_t)9)
            && len > 2 && *p == '(' && TOKISSYM(*(p+1))
            && !isdigit((uchar)*(p+1)))
        {
            int symlen;
            char mysym[TOKNAMMAX];
            
            /* find the matching ')', allowing only symbolic characters */
            ++p, --len;
            for (symlen = 0, q = p ; len && *p != ')' && TOKISSYM(*p) ;
                 ++p, --len, ++symlen) ;

            /* make sure we found the closing paren */
            if (!len || *p != ')')
                errsig(ctx->tokcxerr, ERR_BADISDEF);
            ++p, --len;

            /* if we're folding case, convert the symbol to lower case */
            q = tok_casefold_defsym(ctx, mysym, q, symlen);

            /* check to see if it's defined */
            tok->toktyp = TOKTNUMBER;
            tok->tokval = (tok_find_define(ctx, q, symlen) != 0);
            goto done;
        }

        /* substitute the preprocessor #define, if any */
        if ((df = tok_find_define(ctx, tok->toknam, l)) != 0)
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
            ctx->tokcxmlvl++;

            /* point to the token's expansion and keep going */
            p = df->expan;
            len = df->explen;
            goto nexttoken;
        }
        
        /* look up in symbol table(s), if any */
        for (tab = ctx->tokcxstab ; tab ; tab = tab->toktnxt)
        {
            if ((found = (*tab->toktfsea)(tab, tok->toknam, l, hash,
                                          &tok->toksym)) != 0)
                break;
        }
        
        if (found && tok->toksym.tokstyp == TOKSTKW)
            tok->toktyp = tok->toksym.toksval;
        else
        {
            tok->toktyp = TOKTSYMBOL;
            if (!found) tok->toksym.tokstyp = TOKSTUNK;
        }
        goto done;
    }
    else if (isdigit((uchar)*p))
    {
        long acc = 0;
        
        /* check for octal/hex */
        if (*p == '0')
        {
            ++p, --len;
            if (len && (*p == 'x' || *p == 'X'))
            {
                /* hex */
                ++p, --len;
                while (len && TOKISHEX(*p))
                {
                    acc = (acc << 4) + TOKHEX2INT(*p);
                    ++p, --len;
                }
            }
            else
            {
                /* octal */
                while (len && TOKISOCT(*p))
                {
                    acc = (acc << 3) + TOKOCT2INT(*p);
                    ++p, --len;
                }
            }
        }
        else
        {
            /* decimal */
            while (len && isdigit((uchar)*p))
            {
                acc = (acc << 1) + (acc << 3) + TOKDEC2INT(*p);
                ++p, --len;
            }
        }
        tok->tokval = acc;
        tok->toktyp = TOKTNUMBER;
        goto done;
    }
    else if (*p == '"' || *p == '\'')
    {
        char  delim;                 /* closing delimiter we're looking for */
        char *strstart;                       /* pointer to start of string */
        int   warned;
        
        delim = *p;
        --len;
        strstart = ++p;

        if (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* 
             *   read from the special "<<" expansion string - use the
             *   version for a "<<" at the very beginning of the string 
             */
            p = tokmac1s;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;
            goto nexttoken;
        }
        tok->toktyp = (delim == '"' ? TOKTDSTRING : TOKTSSTRING);
        
        tok->tokofs = (*ctx->tokcxsst)(ctx->tokcxscx);  /* start the string */
        for (warned = FALSE ;; )
        {
            if (len >= 2 && *p == '\\')
            {
                if (*(p+1) == '"' || *(p+1) == '\'')
                {
                    (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                     (ushort)(p - strstart));
                    strstart = p + 1;
                }
                p += 2;
                len -= 2;
            }
            else if (len == 0 || *p == delim ||
                     (delim == '"' && len >= 2 && *p == '<' && *(p+1) == '<'
                      && !(ctx->tokcxflg & TOKCXFINMAC)))
            {
                (*ctx->tokcxsad)(ctx->tokcxscx, strstart,
                                 (ushort)(p - strstart));
                if (len == 0)
                {
                    if (ctx->tokcxmlvl)
                    {
                        ctx->tokcxmlvl--;
                        p = ctx->tokcxmsav[ctx->tokcxmlvl];
                        len = ctx->tokcxmsvl[ctx->tokcxmlvl];
                    }
                    else
                        (*ctx->tokcxsad)(ctx->tokcxscx, " ", (ushort)1);
                    
                    while (len == 0)
                    {
                        if (tokgetlin(ctx, FALSE))
                            errsig(ctx->tokcxerr, ERR_STREOF);
                        p = ctx->tokcxptr;
                        len = ctx->tokcxlen;

                        /* warn if it looks like the end of an object */
                        if (!warned && len && (*p == ';' || *p == '}'))
                        {
                            errlog(ctx->tokcxerr, ERR_STREND);
                            warned = TRUE;     /* warn only once per string */
                        }

                        /* scan past whitespace at start of line */
                        while (len && t_isspace(*p)) ++p, --len;
                    }
                    strstart = p;
                }
                else break;
            }
            else
                ++p, --len;
        }

        /* end the string */
        (*ctx->tokcxsend)(ctx->tokcxscx);

        /* check to see how it ended */
        if (len != 0 && *p == delim)
        {
            /* 
             *   We ended with the matching delimiter.  Move past the
             *   closing delimiter. 
             */
            ++p;
            --len;

            /*
             *   If we have a pending close paren we need to put in
             *   because of an embedded expression that occurred earlier
             *   in the string, parse the macro to provide the paren.  
             */
            if ((ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT) != 0
                && !(ctx->tokcxflg & TOKCXFINMAC))
            {
                /* clear the flag */
                ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;

                /* push the current parsing position */
                if (ctx->tokcxmlvl >= TOKMACNEST)
                    errsig(ctx->tokcxerr, ERR_MACNEST);
                ctx->tokcxmsav[ctx->tokcxmlvl] = p;
                ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
                ctx->tokcxmlvl++;

                /* parse the macro */
                p = tokmac4;
                len = strlen(p);
            }
        }
        else if (len != 0 && *p == '<')
        {
            /* save the current parsing position */
            if (ctx->tokcxmlvl >= TOKMACNEST)
                errsig(ctx->tokcxerr, ERR_MACNEST);
            ctx->tokcxmsav[ctx->tokcxmlvl] = p + 2;
            ctx->tokcxmsvl[ctx->tokcxmlvl] = len - 2;
            ctx->tokcxmlvl++;

            /* read from the "<<" expansion */
            p = tokmac1;
            len = strlen(p);
            ctx->tokcxflg |= TOKCXFINMAC;

            /* 
             *   Set the special push-a-paren flag: we'll return an open
             *   paren now, so that we have an open paren before the
             *   string, and then on the next call to toknext() we'll
             *   immediately return the string we've already parsed here.
             *   This will ensure that everything in the string is
             *   properly grouped together as a single indivisible
             *   expression.
             *   
             *   Note that we only need to do this for the first embedded
             *   expression in a string.  Once we have a close paren
             *   pending, we don't need more open parens.  
             */
            if (!(ctx->tokcxflg & TOKCXF_EMBED_PAREN_AFT))
            {
                ctx->tokcxflg |= TOKCXF_EMBED_PAREN_PRE;
                tok->toktyp = TOKTLPAR;
            }
        }
        goto done;
    }
    else if (len >= 2 && *p == '>' && *(p+1) == '>'
             && (ctx->tokcxflg & TOKCXFINMAC) != 0)
    {
        /* skip the ">>" */
        ctx->tokcxflg &= ~TOKCXFINMAC;
        p += 2;
        len -= 2;

        /* save the current parsing position */
        if (ctx->tokcxmlvl >= TOKMACNEST)
            errsig(ctx->tokcxerr, ERR_MACNEST);
        ctx->tokcxmsav[ctx->tokcxmlvl] = p;
        ctx->tokcxmsvl[ctx->tokcxmlvl] = len;
        ctx->tokcxmlvl++;

        if (*p == '"')
        {
            ++(ctx->tokcxmsav[ctx->tokcxmlvl - 1]);
            --(ctx->tokcxmsvl[ctx->tokcxmlvl - 1]);
            p = tokmac3;

            /* 
             *   we won't need an extra closing paren now, since tokmac3
             *   provides it 
             */
            ctx->tokcxflg &= ~TOKCXF_EMBED_PAREN_AFT;
        }
        else
        {
            /* 
             *   The string is continuing.  Set a flag to note that we
             *   need to provide a close paren after the end of the
             *   string, and parse the glue (tokmac2) that goes between
             *   the expression and the resumption of the string. 
             */
            ctx->tokcxflg |= TOKCXF_EMBED_PAREN_AFT;
            p = tokmac2;
        }

        len = strlen(p);
        goto nexttoken;
    }
    else
    {
        tokscdef *sc;
        
        for (sc = ctx->tokcxsc[ctx->tokcxinx[(uchar)*p]] ; sc ;
             sc = sc->tokscnxt)
        {
            if (toksceq(sc->tokscstr, p, sc->toksclen, len))
            {
                tok->toktyp = sc->toksctyp;
                p += sc->toksclen;
                len -= sc->toksclen;
                goto done;
            }
        }
        errsig(ctx->tokcxerr, ERR_INVTOK);
    }
    
done:
    ctx->tokcxptr = p;
    ctx->tokcxlen = len;
    return(tok->toktyp);
}